

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O0

void __thiscall Dumper::printName(Dumper *this,RWNode *node)

{
  RWNode *in_RSI;
  long in_RDI;
  int i;
  Value *val;
  string nm;
  char *name;
  Value *in_stack_00000228;
  RWNodeType in_stack_ffffffffffffff94;
  int iVar1;
  string local_68 [36];
  undefined4 local_44;
  long local_40;
  string local_38 [32];
  long local_18;
  RWNode *local_10;
  
  if (in_RSI == (RWNode *)0x0) {
    printf("nullptr");
    return;
  }
  if (in_RSI == dg::dda::UNKNOWN_MEMORY) {
    printf("unknown mem");
    return;
  }
  local_18 = 0;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_38);
  if (local_18 == 0) {
    local_40 = dg::dda::LLVMDataDependenceAnalysis::getValue(*(RWNode **)(in_RDI + 8));
    if (local_40 == 0) {
      dg::dda::RWNode::getType(local_10);
      printRWNodeType(in_stack_ffffffffffffff94);
      printId((RWNode *)0x178bfb);
      local_44 = 1;
      goto LAB_00178cb6;
    }
    getInstName_abi_cxx11_(in_stack_00000228);
    std::__cxx11::string::operator=(local_38,local_68);
    std::__cxx11::string::~string(local_68);
    local_18 = std::__cxx11::string::c_str();
  }
  for (iVar1 = 0; *(char *)(local_18 + iVar1) != '\0'; iVar1 = iVar1 + 1) {
    if (0x45 < iVar1) {
      printf(" ...");
      break;
    }
    if (*(char *)(local_18 + iVar1) == '\"') {
      putchar(0x5c);
    }
    putchar((int)*(char *)(local_18 + iVar1));
  }
  local_44 = 0;
LAB_00178cb6:
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void printName(const RWNode *node) {
        if (node == nullptr) {
            printf("nullptr");
            return;
        }

        if (node == UNKNOWN_MEMORY) {
            printf("unknown mem");
            return;
        }

        const char *name = nullptr;

        std::string nm;
        if (!name) {
            const auto *val = DDA->getValue(node);
            if (!val) {
                printRWNodeType(node->getType());
                printId(node);
                return;
            }

            nm = getInstName(val);
            name = nm.c_str();
        }

        // escape the " character
        for (int i = 0; name[i] != '\0'; ++i) {
            // crop long names
            if (i >= 70) {
                printf(" ...");
                break;
            }

            if (name[i] == '"')
                putchar('\\');

            putchar(name[i]);
        }
    }